

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ResizeBilinearLayerParams::Clear(ResizeBilinearLayerParams *this)

{
  Arena *pAVar1;
  ResizeBilinearLayerParams *this_local;
  
  google::protobuf::RepeatedField<unsigned_long>::Clear(&this->targetsize_);
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->mode_ != (SamplingMode *)0x0)) &&
     (this->mode_ != (SamplingMode *)0x0)) {
    (*(this->mode_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->mode_ = (SamplingMode *)0x0;
  return;
}

Assistant:

void ResizeBilinearLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.ResizeBilinearLayerParams)
  targetsize_.Clear();
  if (GetArenaNoVirtual() == NULL && mode_ != NULL) {
    delete mode_;
  }
  mode_ = NULL;
}